

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-messages-react.c
# Opt level: O0

void borg_react(char *msg,char *buf)

{
  char *what;
  size_t sVar1;
  char *tmp;
  int len;
  char *buf_local;
  char *msg_local;
  
  if ((borg_dont_react) || (borg.trait[0x77] != 0)) {
    borg_note("# Ignoring messages.");
  }
  else {
    if (*borg_cfg != 0) {
      what = format("> Reacting Msg (%s)",msg);
      borg_note(what);
    }
    sVar1 = strlen(buf);
    tmp._4_4_ = (int)sVar1;
    if ((tmp._4_4_ != 0) && (buf[tmp._4_4_ + -1] == ',')) {
      tmp._4_4_ = tmp._4_4_ + -1;
      buf[tmp._4_4_] = '\0';
    }
    if ((int)borg_msg_max < borg_msg_num + 1) {
      borg_note("too many messages");
    }
    else if ((int)borg_msg_siz < borg_msg_len + tmp._4_4_ + 1) {
      borg_note("too much messages");
    }
    else {
      borg_msg_use[borg_msg_num] = 0;
      borg_msg_pos[borg_msg_num] = borg_msg_len;
      my_strcpy(borg_msg_buf + (int)borg_msg_len,buf,(long)((int)borg_msg_siz - (int)borg_msg_len));
      borg_msg_len = borg_msg_len + (short)tmp._4_4_ + 1;
      borg_msg_num = borg_msg_num + 1;
    }
  }
  return;
}

Assistant:

void borg_react(const char *msg, const char *buf)
{
    int len;

    if (borg_dont_react || borg.trait[BI_ISPARALYZED]) {
        borg_note("# Ignoring messages.");
        return;
    }

    /* Note actual message */
    if (borg_cfg[BORG_VERBOSE])
        borg_note(format("> Reacting Msg (%s)", msg));

    /* Extract length of parsed message */
    len = strlen(buf);

    /* trim off trailing , if there is one, seems to have been introduced to
     * some uniques messages */
    if (len && buf[len - 1] == ',') {
        char *tmp  = (char *)buf; /* cast away const */
        tmp[--len] = 0;
    }

    /* Verify space */
    if (borg_msg_num + 1 > borg_msg_max) {
        borg_note("too many messages");
        return;
    }

    /* Verify space */
    if (borg_msg_len + len + 1 > borg_msg_siz) {
        borg_note("too much messages");
        return;
    }

    /* Assume not used yet */
    borg_msg_use[borg_msg_num] = 0;

    /* Save the message position */
    borg_msg_pos[borg_msg_num] = borg_msg_len;

    /* Save the message text */
    my_strcpy(borg_msg_buf + borg_msg_len, buf, borg_msg_siz - borg_msg_len);

    /* Advance the buf */
    borg_msg_len += len + 1;

    /* Advance the pos */
    borg_msg_num++;
}